

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-chat.cpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar4 = str->_M_string_length;
  sVar5 = 0;
  while ((uVar6 = sVar4, sVar4 != sVar5 &&
         (iVar3 = isspace((int)pcVar1[sVar5]), uVar6 = sVar5, iVar3 != 0))) {
    sVar5 = sVar5 + 1;
  }
  do {
    if (sVar4 <= uVar6) break;
    lVar2 = sVar4 - 1;
    sVar4 = sVar4 - 1;
    iVar3 = isspace((int)pcVar1[lVar2]);
  } while (iVar3 != 0);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

static std::string trim(const std::string & str) {
    size_t start = 0;
    size_t end = str.size();
    while (start < end && isspace(str[start])) {
        start += 1;
    }
    while (end > start && isspace(str[end - 1])) {
        end -= 1;
    }
    return str.substr(start, end - start);
}